

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs_queue.c
# Opt level: O1

int pop_job(jobs_queue_t *q,job_t **j)

{
  size_t sVar1;
  size_t sVar2;
  job_t **ppjVar3;
  job_t *pjVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  pthread_mutex_lock((pthread_mutex_t *)q);
  uVar7 = q->high_bound;
  uVar5 = q->low_bound;
  if (uVar5 == uVar7) {
    q->high_bound = 0;
    q->low_bound = 0;
    *j = (job_t *)0x0;
    q->size = 0;
    iVar6 = 3;
  }
  else {
    if (uVar5 < 0x19000) {
      sVar2 = uVar5 + 1;
      q->low_bound = sVar2;
      pjVar4 = q->array[uVar5];
    }
    else {
      iVar6 = 1;
      if (uVar5 != 0x19000) goto LAB_001041d6;
      uVar7 = uVar7 - 0x19000;
      if (uVar7 != 0) {
        sVar2 = q->low_bound;
        uVar5 = 0;
        do {
          ppjVar3 = q->array + sVar2;
          sVar2 = sVar2 + 1;
          q->array[uVar5] = *ppjVar3;
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
        q->low_bound = sVar2;
      }
      q->low_bound = 0;
      if (uVar7 < 0x19000) {
        ppjVar3 = (job_t **)realloc(q->array,0xc8000);
        if (ppjVar3 == (job_t **)0x0) {
          WriteLogPError("pop_job()");
          iVar6 = 2;
          goto LAB_001041d6;
        }
        q->array = ppjVar3;
        q->capacity = 0x19000;
      }
      q->high_bound = uVar7;
      sVar1 = q->low_bound;
      sVar2 = sVar1 + 1;
      q->low_bound = sVar2;
      pjVar4 = q->array[sVar1];
    }
    *j = pjVar4;
    q->size = uVar7 - sVar2;
    iVar6 = 0;
  }
LAB_001041d6:
  pthread_mutex_unlock((pthread_mutex_t *)q);
  return iVar6;
}

Assistant:

int pop_job(jobs_queue_t* q, job_t **j)
{
  pthread_mutex_lock(&q->lock);
  size_t size, i;
  job_t** ptr;

  if(q->low_bound == q->high_bound)
    {
      q->low_bound = q->high_bound = 0;
      *j = NULL;
#ifdef QUEUEDEBUG
      WriteLog("Queue '%s' is empty", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);

      return 3;//queue is empty
    }
  else if(q->low_bound < QUEUE_SIZE_RESERVE)
    {
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }
  else if(q->low_bound == QUEUE_SIZE_RESERVE)
    {
      size = (q->high_bound) - (q->low_bound);//size of the queue
      //moving all data to zero level and reset the low_bound to null
      for(i=0; i < size; i++)
        q->array[i]=q->array[(q->low_bound)++];
      q->low_bound = 0;//reset low_bound
      if(size < QUEUE_SIZE_RESERVE)
        {
          ptr=((job_t**)realloc(q->array,QUEUE_SIZE_RESERVE*sizeof(job_t*)));
          if(ptr == NULL)
            {
              WriteLogPError("pop_job()");
              pthread_mutex_unlock(&q->lock);
              return 2;
            }
          q->array = ptr;
          q->capacity=QUEUE_SIZE_RESERVE;
        }
      q->high_bound=size;//set high_bound to size
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }

  pthread_mutex_unlock(&q->lock);
  return 1;

}